

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

void set_compressed(parser *par)

{
  void *pvVar1;
  long in_RDI;
  comp_io_buf *in_stack_ffffffffffffffd0;
  comp_io_buf *this;
  parser *in_stack_ffffffffffffffe0;
  
  finalize_source(in_stack_ffffffffffffffe0);
  if (*(long **)(in_RDI + 0x1e8) != (long *)0x0) {
    (**(code **)(**(long **)(in_RDI + 0x1e8) + 0x18))();
  }
  pvVar1 = operator_new(0xc0);
  comp_io_buf::comp_io_buf(in_stack_ffffffffffffffd0);
  *(void **)(in_RDI + 0x1e8) = pvVar1;
  this = *(comp_io_buf **)(in_RDI + 0x210);
  if (this != (comp_io_buf *)0x0) {
    (*(this->super_io_buf)._vptr_io_buf[3])();
  }
  pvVar1 = operator_new(0xc0);
  comp_io_buf::comp_io_buf(this);
  *(void **)(in_RDI + 0x210) = pvVar1;
  return;
}

Assistant:

void set_compressed(parser* par)
{
  finalize_source(par);
  delete par->input;
  par->input = new comp_io_buf;
  delete par->output;
  par->output = new comp_io_buf;
}